

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodOptions::Clear(MethodOptions *this)

{
  long in_RDI;
  uint32 cached_has_bits;
  ExtensionSet *in_stack_ffffffffffffffb0;
  
  internal::ExtensionSet::Clear(in_stack_ffffffffffffffb0);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear
            ((RepeatedPtrField<google::protobuf::UninterpretedOption> *)0x515032);
  if ((*(uint *)(in_RDI + 0x28) & 3) != 0) {
    memset((void *)(in_RDI + 0x48),0,8);
  }
  memset((void *)(in_RDI + 0x28),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 0x20))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)(in_RDI + 0x20));
  }
  return;
}

Assistant:

void MethodOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.MethodOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  uninterpreted_option_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    ::memset(&deprecated_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&idempotency_level_) -
        reinterpret_cast<char*>(&deprecated_)) + sizeof(idempotency_level_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}